

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O0

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_neighbours
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          Simplex *alpha,Simplex *res,bool keep_only_superior)

{
  bool bVar1;
  reference pVVar2;
  _Self local_50;
  _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  local_48;
  _Base_ptr local_40;
  uint local_34;
  _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  local_30;
  const_iterator alpha_vertex;
  bool keep_only_superior_local;
  Simplex *res_local;
  Simplex *alpha_local;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this_local;
  
  alpha_vertex._M_node._7_1_ = keep_only_superior;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  clear(res);
  local_30._M_node =
       (_Base_ptr)
       Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
       ::begin(alpha);
  pVVar2 = std::
           _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
           ::operator*(&local_30);
  local_34 = pVVar2->vertex;
  (*this->_vptr_Skeleton_blocker_complex[5])
            (this,(ulong)local_34,res,(ulong)(alpha_vertex._M_node._7_1_ & 1));
  local_48._M_node =
       (_Base_ptr)
       Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
       ::begin(alpha);
  local_40 = (_Base_ptr)
             std::
             _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
             ::operator++(&local_48,0);
  local_30._M_node = local_40;
  while( true ) {
    local_50._M_node =
         (_Base_ptr)
         Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
         ::end(alpha);
    bVar1 = std::operator!=(&local_30,&local_50);
    if (!bVar1) break;
    pVVar2 = std::
             _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
             ::operator*(&local_30);
    (*this->_vptr_Skeleton_blocker_complex[7])
              (this,(ulong)(uint)pVVar2->vertex,res,(ulong)(alpha_vertex._M_node._7_1_ & 1));
    std::
    _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

virtual void add_neighbours(const Simplex &alpha, Simplex & res,
                              bool keep_only_superior = false) const {
    res.clear();
    auto alpha_vertex = alpha.begin();
    add_neighbours(*alpha_vertex, res, keep_only_superior);
    for (alpha_vertex = (alpha.begin())++; alpha_vertex != alpha.end();
         ++alpha_vertex)
      keep_neighbours(*alpha_vertex, res, keep_only_superior);
  }